

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

Result<void> * __thiscall
Chainstate::InvalidateCoinsDBOnDisk(Result<void> *__return_storage_ptr__,Chainstate *this)

{
  long lVar1;
  __uniq_ptr_data<CDBWrapper,_std::default_delete<CDBWrapper>,_true,_true> _Var2;
  _Head_base<0UL,_CoinsViews_*,_false> __ptr;
  unique_ptr<CoinsViews,_std::default_delete<CoinsViews>_> *puVar3;
  unique_ptr<CoinsViews,_std::default_delete<CoinsViews>_> *this_00;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  path local_1b0;
  char local_188;
  string dest_str;
  string src_str;
  string target;
  string dbpath;
  path local_b0;
  path invalid_path;
  path snapshot_datadir;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>._M_payload.
      super__Optional_payload_base<uint256>._M_engaged == false) {
    __assert_fail("cs.m_from_snapshot_blockhash",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0x18b0,"fs::path GetSnapshotCoinsDBPath(Chainstate &)");
  }
  this_00 = &this->m_coins_views;
  puVar3 = inline_assertion_check<true,std::unique_ptr<CoinsViews,std::default_delete<CoinsViews>>&>
                     (this_00,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.h"
                      ,0x277,"CoinsDB","m_coins_views");
  _Var2.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
  super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
  super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl =
       (((puVar3->_M_t).super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
         super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
         super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl)->m_dbview).m_db._M_t.
       super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>;
  if (*(char *)((long)_Var2.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t
                      .super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                      super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl + 0x68) != '\x01') {
    std::filesystem::__cxx11::path::path
              (&local_1b0,
               (path *)((long)_Var2.
                              super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>
                              .super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl + 0x40));
    local_188 = '\x01';
    std::filesystem::__cxx11::path::path(&snapshot_datadir.super_path,&local_1b0);
    if (local_188 == '\x01') {
      local_188 = '\0';
      std::filesystem::__cxx11::path::~path(&local_1b0);
    }
    __ptr._M_head_impl =
         (this_00->_M_t).super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
         super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
         super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl;
    (this_00->_M_t).super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
    super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
    super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl = (CoinsViews *)0x0;
    if (__ptr._M_head_impl != (CoinsViews *)0x0) {
      std::default_delete<CoinsViews>::operator()
                ((default_delete<CoinsViews> *)this_00,__ptr._M_head_impl);
    }
    std::filesystem::__cxx11::path::path(&local_b0,&snapshot_datadir.super_path);
    std::filesystem::__cxx11::path::_M_concat(&local_b0,8,"_INVALID");
    std::filesystem::__cxx11::path::path(&invalid_path.super_path,&local_b0);
    std::filesystem::__cxx11::path::~path(&local_b0);
    dbpath._M_dataplus._M_p = (pointer)&dbpath.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&dbpath,snapshot_datadir.super_path._M_pathname._M_dataplus._M_p,
               snapshot_datadir.super_path._M_pathname._M_dataplus._M_p +
               snapshot_datadir.super_path._M_pathname._M_string_length);
    target._M_dataplus._M_p = (pointer)&target.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&target,invalid_path.super_path._M_pathname._M_dataplus._M_p,
               invalid_path.super_path._M_pathname._M_dataplus._M_p +
               invalid_path.super_path._M_pathname._M_string_length);
    logging_function._M_str = "InvalidateCoinsDBOnDisk";
    logging_function._M_len = 0x17;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file._M_len = 0x57;
    ::LogPrintf_<std::__cxx11::string,std::__cxx11::string>
              (logging_function,source_file,0x18c1,ALL,Info,
               "[snapshot] renaming snapshot datadir %s to %s\n",&dbpath,&target);
    std::filesystem::rename((path *)&snapshot_datadir,(path *)&invalid_path);
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\x01';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)target._M_dataplus._M_p != &target.field_2) {
      operator_delete(target._M_dataplus._M_p,target.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dbpath._M_dataplus._M_p != &dbpath.field_2) {
      operator_delete(dbpath._M_dataplus._M_p,dbpath.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path(&invalid_path.super_path);
    std::filesystem::__cxx11::path::~path(&snapshot_datadir.super_path);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return __return_storage_ptr__;
    }
    __stack_chk_fail();
  }
  __assert_fail("storage_path_maybe",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                ,0x18b3,"fs::path GetSnapshotCoinsDBPath(Chainstate &)");
}

Assistant:

util::Result<void> Chainstate::InvalidateCoinsDBOnDisk()
{
    fs::path snapshot_datadir = GetSnapshotCoinsDBPath(*this);

    // Coins views no longer usable.
    m_coins_views.reset();

    auto invalid_path = snapshot_datadir + "_INVALID";
    std::string dbpath = fs::PathToString(snapshot_datadir);
    std::string target = fs::PathToString(invalid_path);
    LogPrintf("[snapshot] renaming snapshot datadir %s to %s\n", dbpath, target);

    // The invalid snapshot datadir is simply moved and not deleted because we may
    // want to do forensics later during issue investigation. The user is instructed
    // accordingly in MaybeCompleteSnapshotValidation().
    try {
        fs::rename(snapshot_datadir, invalid_path);
    } catch (const fs::filesystem_error& e) {
        auto src_str = fs::PathToString(snapshot_datadir);
        auto dest_str = fs::PathToString(invalid_path);

        LogPrintf("%s: error renaming file '%s' -> '%s': %s\n",
                __func__, src_str, dest_str, e.what());
        return util::Error{strprintf(_(
            "Rename of '%s' -> '%s' failed. "
            "You should resolve this by manually moving or deleting the invalid "
            "snapshot directory %s, otherwise you will encounter the same error again "
            "on the next startup."),
            src_str, dest_str, src_str)};
    }
    return {};
}